

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

bool tinyusdz::is_identity(matrix2f *m)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  
  fVar1 = m->m[0][0];
  if (-1 < (int)fVar1) {
    uVar2 = (int)fVar1 + 0xc0800000;
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    if (uVar3 < 2) {
      fVar1 = m->m[0][1];
      if ((int)fVar1 < 0) {
        if (ABS(fVar1) != 0.0) {
          return false;
        }
      }
      else if (1 < (uint)fVar1) {
        return false;
      }
      fVar1 = m->m[1][0];
      if ((int)fVar1 < 0) {
        if (ABS(fVar1) == 0.0) goto LAB_001992e0;
      }
      else if ((uint)fVar1 < 2) {
LAB_001992e0:
        fVar1 = m->m[1][1];
        if (-1 < (int)fVar1) {
          return (uint)fVar1 < 2;
        }
        return ABS(fVar1) == 0.0;
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix2f &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][1], 0.0f, kIdentityMaxUlps);
}